

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void starvation_branch_with_pivot(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  int iVar2;
  Enum EVar3;
  undefined1 *puVar4;
  __atomic_base<unsigned_long> *in_RDI;
  double __x;
  Expression_lhs<const_std::atomic<unsigned_long>_&> EVar5;
  ResultBuilder DOCTEST_RB;
  size_t b;
  int w;
  size_t l;
  size_t target;
  size_t N;
  Task curr;
  Task prev;
  atomic<unsigned_long> counter;
  Executor executor;
  Taskflow taskflow;
  Task *in_stack_fffffffffffffc38;
  Result *res;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffc44;
  Executor *in_stack_fffffffffffffc48;
  __atomic_base<unsigned_long> *file;
  Taskflow *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc70;
  Enum EVar7;
  undefined4 in_stack_fffffffffffffc74;
  ExpressionDecomposer local_384;
  anon_class_40_5_fbc067b1 *in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  unsigned_long *in_stack_fffffffffffffcc0;
  Expression_lhs<const_std::atomic<unsigned_long>_&> *in_stack_fffffffffffffcc8;
  element_type *in_stack_fffffffffffffd28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd30;
  Executor *in_stack_fffffffffffffd38;
  ulong local_278;
  Task local_260;
  ulong local_258;
  long local_250;
  ulong local_248;
  Task local_240;
  Task local_238;
  undefined1 local_230 [24];
  undefined1 local_218 [16];
  undefined1 local_208 [512];
  __atomic_base<unsigned_long> *local_8;
  
  local_8 = in_RDI;
  tf::Taskflow::Taskflow(in_stack_fffffffffffffc60);
  puVar4 = local_218;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),in_stack_fffffffffffffc38
            );
  tf::Executor::Executor
            (in_stack_fffffffffffffd38,(size_t)in_stack_fffffffffffffd30._M_pi,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffd28);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x117bd5);
  memset(local_230,0,8);
  tf::Task::Task(&local_238);
  tf::Task::Task(&local_240);
  local_248 = 1000;
  local_250 = 0;
  std::__atomic_base<unsigned_long>::operator=
            (local_8,(__int_type_conflict1)in_stack_fffffffffffffc48);
  file = local_8;
  for (local_258 = 0; local_258 < local_248; local_258 = local_258 + 1) {
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:103:29),_nullptr>
              ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
               (anon_class_8_1_bc7188dc *)in_stack_fffffffffffffc80);
    tf::Task::operator=(&local_240,&local_260);
    if (local_258 != 0) {
      tf::Task::succeed<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 in_stack_fffffffffffffc38);
    }
    tf::Task::operator=(&local_238,&local_240);
  }
  rand();
  for (local_278 = 0; EVar7 = (Enum)((ulong)puVar4 >> 0x20), local_278 < local_248;
      local_278 = local_278 + 1) {
    iVar2 = rand();
    if (iVar2 % 10 == 0) {
      local_250 = local_250 + 1;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:128:24),_nullptr>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 (anon_class_8_1_bc7188dc *)in_stack_fffffffffffffc80);
      tf::Task::succeed<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 in_stack_fffffffffffffc38);
    }
    else {
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:117:24),_nullptr>
                ((FlowBuilder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 in_stack_fffffffffffffc80);
      tf::Task::succeed<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                 in_stack_fffffffffffffc38);
    }
  }
  puVar4 = local_208;
  tf::Executor::run(in_stack_fffffffffffffc48,
                    (Taskflow *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  iVar2 = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffd28,puVar4);
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
  res = (Result *)0x18308d;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffffc60,EVar7,(char *)file,iVar2,
             (char *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),"",
             (char *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_384,DT_REQUIRE);
  EVar5 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<unsigned_long>,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (atomic<unsigned_long> *)res);
  EVar3 = EVar5.m_at;
  EVar7 = EVar3;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar3,in_stack_fffffffffffffc40),res);
  doctest::detail::Result::~Result((Result *)0x117f82);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffcb0,__x);
  uVar6 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffc40);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)CONCAT44(EVar3,uVar6));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x118066);
    tf::Executor::~Executor((Executor *)CONCAT44(in_stack_fffffffffffffc74,EVar7));
    tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar3,uVar6));
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void starvation_branch_with_pivot(size_t W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);
  std::atomic<size_t> counter{0};

  tf::Task prev, curr;
  
  // large linear chain followed by many branches
  size_t N = 1000;
  size_t target = 0;
  counter = 0;
  
  for(size_t l=0; l<N; l++) {
    curr = taskflow.emplace([&](){
      counter.fetch_add(1, std::memory_order_relaxed);
    });
    if(l) {
      curr.succeed(prev);
    }
    prev = curr;
  }

  const int w = rand() % W;

  for(size_t b=0; b<N; b++) {
    // wait with a probability of 0.9
    if(rand() % 10 != 0) {
      taskflow.emplace([&](){ 
        if(executor.this_worker_id() != w) {
          while(counter.load(std::memory_order_relaxed) != target + N) {
            std::this_thread::yield();
          }
        }
      }).succeed(curr);
    }
    // increment the counter with a probability of 0.1
    else {
      target++;
      taskflow.emplace([&](){ 
        counter.fetch_add(1, std::memory_order_relaxed);
      }).succeed(curr);
    }
  }

  executor.run(taskflow).wait();

  REQUIRE(counter == target + N);
  
}